

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

Dimension_ConstantDimension *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::MILSpec::Dimension_ConstantDimension>(Arena *arena)

{
  Dimension_ConstantDimension *this;
  
  if (arena == (Arena *)0x0) {
    this = (Dimension_ConstantDimension *)operator_new(0x20);
    CoreML::Specification::MILSpec::Dimension_ConstantDimension::Dimension_ConstantDimension
              (this,(Arena *)0x0,false);
  }
  else {
    this = (Dimension_ConstantDimension *)
           AllocateAlignedWithHook
                     (arena,0x20,
                      (type_info *)
                      &CoreML::Specification::MILSpec::Dimension_ConstantDimension::typeinfo);
    CoreML::Specification::MILSpec::Dimension_ConstantDimension::Dimension_ConstantDimension
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }